

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Reprepare(Vdbe *p)

{
  byte bVar1;
  char *zSql_00;
  sqlite3 *db_00;
  u8 prepFlags;
  sqlite3 *db;
  char *zSql;
  sqlite3_stmt *pNew;
  Vdbe *pVStack_18;
  int rc;
  Vdbe *p_local;
  
  pVStack_18 = p;
  zSql_00 = sqlite3_sql((sqlite3_stmt *)p);
  db_00 = sqlite3VdbeDb(pVStack_18);
  bVar1 = sqlite3VdbePrepareFlags(pVStack_18);
  pNew._4_4_ = sqlite3LockAndPrepare
                         (db_00,zSql_00,-1,(uint)bVar1,pVStack_18,(sqlite3_stmt **)&zSql,
                          (char **)0x0);
  if (pNew._4_4_ == 0) {
    sqlite3VdbeSwap((Vdbe *)zSql,pVStack_18);
    sqlite3TransferBindings((sqlite3_stmt *)zSql,(sqlite3_stmt *)pVStack_18);
    sqlite3VdbeResetStepResult((Vdbe *)zSql);
    sqlite3VdbeFinalize((Vdbe *)zSql);
    p_local._4_4_ = 0;
  }
  else {
    if (pNew._4_4_ == 7) {
      sqlite3OomFault(db_00);
    }
    p_local._4_4_ = pNew._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Reprepare(Vdbe *p){
  int rc;
  sqlite3_stmt *pNew;
  const char *zSql;
  sqlite3 *db;
  u8 prepFlags;

  assert( sqlite3_mutex_held(sqlite3VdbeDb(p)->mutex) );
  zSql = sqlite3_sql((sqlite3_stmt *)p);
  assert( zSql!=0 );  /* Reprepare only called for prepare_v2() statements */
  db = sqlite3VdbeDb(p);
  assert( sqlite3_mutex_held(db->mutex) );
  prepFlags = sqlite3VdbePrepareFlags(p);
  rc = sqlite3LockAndPrepare(db, zSql, -1, prepFlags, p, &pNew, 0);
  if( rc ){
    if( rc==SQLITE_NOMEM ){
      sqlite3OomFault(db);
    }
    assert( pNew==0 );
    return rc;
  }else{
    assert( pNew!=0 );
  }
  sqlite3VdbeSwap((Vdbe*)pNew, p);
  sqlite3TransferBindings(pNew, (sqlite3_stmt*)p);
  sqlite3VdbeResetStepResult((Vdbe*)pNew);
  sqlite3VdbeFinalize((Vdbe*)pNew);
  return SQLITE_OK;
}